

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_DeleteKVPair(ktxHashList *pHead,char *key)

{
  uint *puVar1;
  ktxHashList pkVar2;
  UT_hash_table *pUVar3;
  UT_hash_handle *pUVar4;
  long lVar5;
  UT_hash_bucket *pUVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ktxHashList *ppkVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ktx_error_code_e kVar19;
  
  kVar19 = KTX_INVALID_VALUE;
  if (key != (char *)0x0 && pHead != (ktxHashList *)0x0) {
    pkVar2 = *pHead;
    if (pkVar2 == (ktxHashList)0x0) {
      lVar14 = 0;
    }
    else {
      sVar7 = strlen(key);
      uVar10 = (uint)sVar7;
      pcVar8 = key;
      if (uVar10 < 0xc) {
        uVar12 = 0x9e3779b9;
        uVar15 = 0xfeedbeef;
        uVar17 = 0x9e3779b9;
        uVar9 = uVar10;
      }
      else {
        uVar15 = 0xfeedbeef;
        uVar17 = 0x9e3779b9;
        uVar16 = sVar7 & 0xffffffff;
        uVar12 = 0x9e3779b9;
        do {
          iVar11 = (uint)(byte)pcVar8[7] * 0x1000000 + pcVar8[6] * 0x10000 +
                   pcVar8[5] * 0x100 + (int)pcVar8[4] + uVar17;
          uVar9 = (uint)(byte)pcVar8[0xb] * 0x1000000 + pcVar8[10] * 0x10000 +
                  pcVar8[9] * 0x100 + (int)pcVar8[8] + uVar15;
          uVar17 = uVar9 >> 0xd ^
                   (((uint)(byte)pcVar8[3] * 0x1000000 + pcVar8[2] * 0x10000 +
                    pcVar8[1] * 0x100 + (int)*pcVar8 + uVar12) - iVar11) - uVar9;
          uVar15 = uVar17 << 8 ^ (iVar11 - uVar9) - uVar17;
          uVar12 = uVar15 >> 0xd ^ (uVar9 - uVar17) - uVar15;
          uVar9 = uVar12 >> 0xc ^ (uVar17 - uVar15) - uVar12;
          uVar15 = uVar9 << 0x10 ^ (uVar15 - uVar12) - uVar9;
          uVar18 = uVar15 >> 5 ^ (uVar12 - uVar9) - uVar15;
          uVar12 = uVar18 >> 3 ^ (uVar9 - uVar15) - uVar18;
          uVar17 = uVar12 << 10 ^ (uVar15 - uVar18) - uVar12;
          uVar15 = uVar17 >> 0xf ^ (uVar18 - uVar12) - uVar17;
          pcVar8 = pcVar8 + 0xc;
          uVar9 = (int)uVar16 - 0xc;
          uVar16 = (ulong)uVar9;
        } while (0xb < uVar9);
      }
      uVar15 = uVar15 + uVar10;
      switch(uVar9) {
      case 0xb:
        uVar15 = (uint)(byte)pcVar8[10] * 0x1000000 + uVar15;
      case 10:
        uVar15 = pcVar8[9] * 0x10000 + uVar15;
      case 9:
        uVar15 = pcVar8[8] * 0x100 + uVar15;
      case 8:
        uVar17 = (uint)(byte)pcVar8[7] * 0x1000000 + uVar17;
      case 7:
        uVar17 = pcVar8[6] * 0x10000 + uVar17;
      case 6:
        uVar17 = pcVar8[5] * 0x100 + uVar17;
      case 5:
        uVar17 = (int)pcVar8[4] + uVar17;
      case 4:
        uVar12 = (uint)(byte)pcVar8[3] * 0x1000000 + uVar12;
      case 3:
        uVar12 = pcVar8[2] * 0x10000 + uVar12;
      case 2:
        uVar12 = pcVar8[1] * 0x100 + uVar12;
      case 1:
        uVar12 = (int)*pcVar8 + uVar12;
      }
      uVar9 = uVar15 >> 0xd ^ (uVar12 - uVar15) - uVar17;
      uVar17 = uVar9 << 8 ^ (uVar17 - uVar15) - uVar9;
      uVar15 = uVar17 >> 0xd ^ (uVar15 - uVar9) - uVar17;
      uVar12 = uVar15 >> 0xc ^ (uVar9 - uVar17) - uVar15;
      uVar9 = uVar12 << 0x10 ^ (uVar17 - uVar15) - uVar12;
      uVar15 = uVar9 >> 5 ^ (uVar15 - uVar12) - uVar9;
      uVar12 = uVar15 >> 3 ^ (uVar12 - uVar9) - uVar15;
      uVar9 = uVar12 << 10 ^ (uVar9 - uVar15) - uVar12;
      pUVar3 = (pkVar2->hh).tbl;
      pUVar4 = pUVar3->buckets[pUVar3->num_buckets - 1 & (uVar9 >> 0xf ^ uVar15 - (uVar12 + uVar9))]
               .hh_head;
      if (pUVar4 == (UT_hash_handle *)0x0) {
        lVar14 = 0;
      }
      else {
        lVar14 = (long)pUVar4 - pUVar3->hho;
      }
      if (lVar14 == 0) {
        lVar14 = 0;
      }
      else {
        do {
          if ((*(uint *)(lVar14 + 0x50) == uVar10) &&
             (iVar11 = bcmp(*(void **)(lVar14 + 0x48),key,sVar7 & 0xffffffff), iVar11 == 0))
          goto LAB_001d3614;
          if (*(long *)(lVar14 + 0x40) == 0) {
            lVar14 = 0;
          }
          else {
            lVar14 = *(long *)(lVar14 + 0x40) - pUVar3->hho;
          }
        } while (lVar14 != 0);
        lVar14 = 0;
      }
    }
LAB_001d3614:
    kVar19 = KTX_SUCCESS;
    if (lVar14 != 0) {
      lVar5 = *(long *)(lVar14 + 0x28);
      if ((lVar5 == 0) && (*(long *)(lVar14 + 0x30) == 0)) {
        free(((pkVar2->hh).tbl)->buckets);
        free(((*pHead)->hh).tbl);
        *pHead = (ktxHashList)0x0;
      }
      else {
        pUVar3 = (pkVar2->hh).tbl;
        if (lVar14 == (long)pUVar3->tail - pUVar3->hho) {
          pUVar3->tail = (UT_hash_handle *)(pUVar3->hho + lVar5);
        }
        ppkVar13 = pHead;
        if (lVar5 != 0) {
          ppkVar13 = (ktxHashList *)((((*pHead)->hh).tbl)->hho + lVar5 + 0x10);
        }
        *ppkVar13 = *(ktxHashList *)(lVar14 + 0x30);
        if (*(long *)(lVar14 + 0x30) != 0) {
          *(undefined8 *)(*(long *)(lVar14 + 0x30) + 8 + (((*pHead)->hh).tbl)->hho) =
               *(undefined8 *)(lVar14 + 0x28);
        }
        pUVar3 = ((*pHead)->hh).tbl;
        uVar10 = pUVar3->num_buckets - 1 & *(uint *)(lVar14 + 0x54);
        pUVar6 = pUVar3->buckets;
        pUVar6[uVar10].count = pUVar6[uVar10].count - 1;
        if (pUVar6[uVar10].hh_head == (UT_hash_handle *)(lVar14 + 0x20)) {
          pUVar6[uVar10].hh_head = *(UT_hash_handle **)(lVar14 + 0x40);
        }
        lVar5 = *(long *)(lVar14 + 0x38);
        if (lVar5 != 0) {
          *(undefined8 *)(lVar5 + 0x20) = *(undefined8 *)(lVar14 + 0x40);
        }
        if (*(long *)(lVar14 + 0x40) != 0) {
          *(long *)(*(long *)(lVar14 + 0x40) + 0x18) = lVar5;
        }
        puVar1 = &(((*pHead)->hh).tbl)->num_items;
        *puVar1 = *puVar1 - 1;
      }
    }
  }
  return kVar19;
}

Assistant:

KTX_error_code
ktxHashList_DeleteKVPair(ktxHashList* pHead, const char* key)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: pointer to target entry. */
        if (kv != NULL)
            HASH_DEL(*pHead, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}